

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

void arma_autocovar(double *phi,double *theta,int p,int q,double var,double *acov,int lag)

{
  int iVar1;
  int N;
  double *x;
  int *ipiv_00;
  double *A_00;
  double *b_00;
  undefined8 *__ptr;
  double *psi_00;
  undefined8 *__ptr_00;
  void *__ptr_01;
  double local_98;
  double temp;
  int p1;
  int *ipiv;
  double *thph;
  double *th;
  double *ph;
  double *b;
  double *A;
  double *psi;
  double *tcov;
  int local_40;
  int m;
  int t;
  int j;
  int i;
  int lag_local;
  double *acov_local;
  double var_local;
  int q_local;
  int p_local;
  double *theta_local;
  double *phi_local;
  
  N = p + 1;
  x = (double *)malloc((long)N << 3);
  ipiv_00 = (int *)malloc((long)N << 2);
  A_00 = (double *)malloc((long)N * 8 * (long)N);
  b_00 = (double *)malloc((long)N << 3);
  __ptr = (undefined8 *)malloc((long)N << 3);
  psi_00 = (double *)malloc((long)(q + 1) << 3);
  __ptr_00 = (undefined8 *)malloc((long)(q + 1) << 3);
  *__ptr = 0xbff0000000000000;
  *__ptr_00 = 0x3ff0000000000000;
  for (t = 0; t < p; t = t + 1) {
    __ptr[t + 1] = phi[t];
  }
  for (t = 0; t < q; t = t + 1) {
    __ptr_00[t + 1] = theta[t];
  }
  tcov._4_4_ = p;
  if (p < q + 1) {
    tcov._4_4_ = q + 1;
  }
  __ptr_01 = malloc((long)tcov._4_4_ << 3);
  for (t = 0; t < N; t = t + 1) {
    for (m = 0; m < N; m = m + 1) {
      A_00[t * N + m] = 0.0;
      if ((t == m) && (t != 0)) {
        A_00[t * N + m] = 1.0;
      }
      local_40 = t - m;
      if (local_40 < 0) {
        local_40 = -local_40;
      }
      local_40 = t * N + local_40;
      A_00[local_40] = A_00[local_40] - (double)__ptr[m];
    }
  }
  psiweight(phi,theta,psi_00,p,q,q + 1);
  for (t = 0; t < tcov._4_4_; t = t + 1) {
    local_98 = 0.0;
    for (m = 0; m < q + 1; m = m + 1) {
      if (t + m < q + 1) {
        local_98 = (double)__ptr_00[t + m] * psi_00[m] + local_98;
      }
    }
    *(double *)((long)__ptr_01 + (long)t * 8) = local_98 * var;
  }
  for (t = 0; t < N; t = t + 1) {
    b_00[t] = *(double *)((long)__ptr_01 + (long)t * 8);
  }
  ludecomp(A_00,N,ipiv_00);
  linsolve(A_00,N,b_00,ipiv_00,x);
  for (t = 0; iVar1 = N, t < N; t = t + 1) {
    acov[t] = x[t];
  }
  while (t = iVar1, t < lag) {
    local_98 = 0.0;
    for (m = 1; m < N; m = m + 1) {
      local_98 = phi[m + -1] * acov[t - m] + local_98;
    }
    if (t < tcov._4_4_) {
      local_98 = *(double *)((long)__ptr_01 + (long)t * 8) + local_98;
    }
    acov[t] = local_98;
    iVar1 = t + 1;
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  free(psi_00);
  free(x);
  free(A_00);
  free(ipiv_00);
  free(b_00);
  return;
}

Assistant:

void arma_autocovar(double *phi,double *theta,int p,int q,double var,double* acov, int lag) {
	int i,j,t,m;
	double *tcov,*psi,*A,*b,*ph,*th,*thph;
	int *ipiv;
	int p1;
	double temp;
	
	p1 = p+1;
	tcov = (double*) malloc(sizeof(double) * (p1));
	ipiv = (int*) malloc(sizeof(int) * (p1));
	A = (double*) malloc(sizeof(double) * (p1) * (p1));
	b = (double*) malloc(sizeof(double) * (p1));
	ph = (double*) malloc(sizeof(double) * (p1));
	psi = (double*) malloc(sizeof(double) * (q+1));
	th = (double*) malloc(sizeof(double) * (q+1));

	ph[0] = -1.0;
	th[0] = 1.0;
	
	for(i = 0; i < p;++i) {
		ph[i+1] = phi[i];
	}
	
	for(i = 0; i < q;++i) {
		th[i+1] = theta[i];
	}
	
	if (p >= q+1) {
		m = p;
	} else {
		m = q + 1;
	}
	thph = (double*) malloc(sizeof(double) * m);
	// set A
	for(i = 0; i < p1;++i) {
		for(j=0; j < p1;++j) {
			A[i*p1+j] = 0.;
			if (i == j && i != 0) {
				A[i*p1+j] = 1.;
			}

			t = i - j;
			if (t < 0) {
				t = -t;
			} 
			
			A[i*p1+t] -= ph[j];
			
		}
	}
	
	//set b
	
	psiweight(phi,theta,psi,p,q,q+1);
	for(i=0; i < m;++i) {
		
		temp = 0.;
		for(j = 0; j < q+1;++j) {
			if(i+j < q+1) {
				temp += th[i+j] * psi[j];
			}
		}
		thph[i] = temp*var;
		
	}
	
	for(i=0; i < p1;++i) {
		b[i] = thph[i];
	}
	
	ludecomp(A,p1,ipiv);
	linsolve(A,p1,b,ipiv,tcov);
	
	for(i = 0; i < p1;++i) {
		acov[i] = tcov[i];
	}
	
	for(i = p1; i < lag;++i) {
		temp = 0.0;
		for(j = 1; j < p1; ++j) {
			temp+= phi[j-1] * acov[i - j];
		}
		if (i < m) {
			temp += thph[i];
		}
		acov[i] = temp;
	}
	
	free(ph);
	free(th);
	free(thph);
	free(psi);
	free(tcov);
	free(A);
	free(ipiv);
	free(b);
}